

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall
CVmConsoleBanner::CVmConsoleBanner
          (CVmConsoleBanner *this,void *banner_handle,int win_type,unsigned_long style)

{
  int obey_whitespace_00;
  CVmFormatter *pCVar1;
  int in_EDX;
  _func_int **in_RSI;
  CVmConsole *in_RDI;
  int literal_mode;
  int obey_whitespace;
  os_banner_info_t info;
  CVmFormatterBanner *str;
  int in_stack_ffffffffffffff9c;
  CVmFormatterBanner *in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 uVar3;
  CVmFormatterBanner *in_stack_ffffffffffffffb0;
  
  CVmConsole::CVmConsole(in_RDI);
  in_RDI->_vptr_CVmConsole = (_func_int **)&PTR_delete_obj_003e2118;
  uVar3 = 0;
  uVar2 = 0;
  in_RDI[1]._vptr_CVmConsole = in_RSI;
  obey_whitespace_00 =
       os_banner_getinfo(in_RDI[1]._vptr_CVmConsole,(os_banner_info_t *)&stack0xffffffffffffffb0);
  if (in_EDX == 2) {
    uVar2 = 1;
    uVar3 = 1;
  }
  pCVar1 = (CVmFormatter *)operator_new(0xf058);
  CVmFormatterBanner::CVmFormatterBanner
            (in_stack_ffffffffffffffb0,(void *)CONCAT44(uVar3,uVar2),
             (CVmConsole *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(unsigned_long)in_RDI
            );
  in_RDI->disp_str_ = pCVar1;
  CVmFormatterBanner::init_banner
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,obey_whitespace_00,
             (int)((ulong)in_RDI >> 0x20));
  *(int *)&in_RDI[1].disp_str_ = in_EDX;
  return;
}

Assistant:

CVmConsoleBanner::CVmConsoleBanner(void *banner_handle, int win_type,
                                   unsigned long style)
{
    CVmFormatterBanner *str;
    os_banner_info_t info;
    int obey_whitespace = FALSE;
    int literal_mode = FALSE;

    /* remember our OS-level banner handle */
    banner_ = banner_handle;

    /* get osifc-level information on the banner */
    if (!os_banner_getinfo(banner_, &info))
        info.os_line_wrap = FALSE;

    /* 
     *   If it's a text grid window, don't do any line wrapping.  Text grids
     *   simply don't have any line wrapping, so we don't want to impose any
     *   at the formatter level.  Set the formatter to "os line wrap" mode,
     *   to indicate that the formatter doesn't do wrapping - even though
     *   the underlying OS banner window won't do any wrapping either, the
     *   lack of line wrapping counts as OS handling of line wrapping.  
     */
    if (win_type == OS_BANNER_TYPE_TEXTGRID)
    {
        /* do not wrap lines in the formatter */
        info.os_line_wrap = TRUE;

        /* use literal mode, and obey whitespace literally */
        literal_mode = TRUE;
        obey_whitespace = TRUE;
    }

    /* create and initialize our display stream */
    disp_str_ = str = new CVmFormatterBanner(banner_handle, this,
                                             win_type, style);
    str->init_banner(info.os_line_wrap, obey_whitespace, literal_mode);

    /* remember our window type */
    win_type_ = win_type;
}